

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront_workitems_soa.h
# Opt level: O0

void __thiscall
pbrt::SOA<pbrt::MaterialEvalWorkItem<pbrt::DiffuseTransmissionMaterial>_>::GetSetIndirector::
operator=(GetSetIndirector *this,MaterialEvalWorkItem<pbrt::DiffuseTransmissionMaterial> *a)

{
  GetSetIndirector *this_00;
  Normal3f *pNVar1;
  Vector3f *pVVar2;
  Point2f *a_00;
  undefined8 *in_RSI;
  long *in_RDI;
  GetSetIndirector GVar3;
  GetSetIndirector GVar4;
  GetSetIndirector GVar5;
  GetSetIndirector GVar6;
  GetSetIndirector GVar7;
  GetSetIndirector GVar8;
  MediumInterface *in_stack_fffffffffffffe78;
  SampledSpectrum *in_stack_fffffffffffffe98;
  GetSetIndirector *in_stack_fffffffffffffea0;
  SampledWavelengths *in_stack_fffffffffffffeb8;
  GetSetIndirector *in_stack_fffffffffffffec0;
  Point3fi *in_stack_fffffffffffffec8;
  GetSetIndirector *in_stack_fffffffffffffed0;
  GetSetIndirector local_f0;
  GetSetIndirector local_e0;
  GetSetIndirector local_d0;
  GetSetIndirector local_c0;
  GetSetIndirector local_b0;
  GetSetIndirector local_a0;
  GetSetIndirector local_90;
  GetSetIndirector local_80;
  GetSetIndirector local_70;
  GetSetIndirector local_60;
  SOA<pbrt::Point3fi> *local_50;
  int local_48;
  SOA<pbrt::SampledSpectrum> *local_40;
  int local_38;
  SOA<pbrt::SampledSpectrum> *local_30;
  int local_28;
  SOA<pbrt::SampledWavelengths> *local_20;
  int local_18;
  undefined8 *local_10;
  
  *(undefined8 *)(*(long *)(*in_RDI + 8) + (long)(int)in_RDI[1] * 8) = *in_RSI;
  this_00 = (GetSetIndirector *)((long)in_RSI + 0x94);
  local_10 = in_RSI;
  GVar3 = SOA<pbrt::SampledWavelengths>::operator[]
                    ((SOA<pbrt::SampledWavelengths> *)(*in_RDI + 0x10),(int)in_RDI[1]);
  local_20 = GVar3.soa;
  local_18 = GVar3.index;
  SOA<pbrt::SampledWavelengths>::GetSetIndirector::operator=
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  GVar4 = SOA<pbrt::SampledSpectrum>::operator[]
                    ((SOA<pbrt::SampledSpectrum> *)(*in_RDI + 0x38),(int)in_RDI[1]);
  local_30 = GVar4.soa;
  local_28 = GVar4.index;
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  GVar4 = SOA<pbrt::SampledSpectrum>::operator[]
                    ((SOA<pbrt::SampledSpectrum> *)(*in_RDI + 0x50),(int)in_RDI[1]);
  local_40 = GVar4.soa;
  local_38 = GVar4.index;
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  GVar5 = SOA<pbrt::Point3fi>::operator[]((SOA<pbrt::Point3fi> *)(*in_RDI + 0x68),(int)in_RDI[1]);
  local_50 = GVar5.soa;
  local_48 = GVar5.i;
  SOA<pbrt::Point3fi>::GetSetIndirector::operator=
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pNVar1 = (Normal3f *)(local_10 + 4);
  GVar6 = SOA<pbrt::Normal3<float>_>::operator[]
                    ((SOA<pbrt::Normal3<float>_> *)(*in_RDI + 0xb8),(int)in_RDI[1]);
  local_60.soa = GVar6.soa;
  local_60.i = GVar6.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_60,pNVar1);
  pNVar1 = (Normal3f *)((long)local_10 + 0x4c);
  GVar6 = SOA<pbrt::Normal3<float>_>::operator[]
                    ((SOA<pbrt::Normal3<float>_> *)(*in_RDI + 0xd8),(int)in_RDI[1]);
  local_70.soa = GVar6.soa;
  local_70.i = GVar6.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_70,pNVar1);
  pVVar2 = (Vector3f *)((long)local_10 + 0x2c);
  GVar7 = SOA<pbrt::Vector3<float>_>::operator[]
                    ((SOA<pbrt::Vector3<float>_> *)(*in_RDI + 0xf8),(int)in_RDI[1]);
  local_80.soa = GVar7.soa;
  local_80.i = GVar7.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_80,pVVar2);
  pVVar2 = (Vector3f *)(local_10 + 7);
  GVar7 = SOA<pbrt::Vector3<float>_>::operator[]
                    ((SOA<pbrt::Vector3<float>_> *)(*in_RDI + 0x118),(int)in_RDI[1]);
  local_90.soa = GVar7.soa;
  local_90.i = GVar7.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_90,pVVar2);
  pVVar2 = (Vector3f *)(local_10 + 0xb);
  GVar7 = SOA<pbrt::Vector3<float>_>::operator[]
                    ((SOA<pbrt::Vector3<float>_> *)(*in_RDI + 0x138),(int)in_RDI[1]);
  local_a0.soa = GVar7.soa;
  local_a0.i = GVar7.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_a0,pVVar2);
  pVVar2 = (Vector3f *)((long)local_10 + 100);
  GVar7 = SOA<pbrt::Vector3<float>_>::operator[]
                    ((SOA<pbrt::Vector3<float>_> *)(*in_RDI + 0x158),(int)in_RDI[1]);
  local_b0.soa = GVar7.soa;
  local_b0.i = GVar7.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_b0,pVVar2);
  pNVar1 = (Normal3f *)(local_10 + 0xe);
  GVar6 = SOA<pbrt::Normal3<float>_>::operator[]
                    ((SOA<pbrt::Normal3<float>_> *)(*in_RDI + 0x178),(int)in_RDI[1]);
  local_c0.soa = GVar6.soa;
  local_c0.i = GVar6.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_c0,pNVar1);
  pNVar1 = (Normal3f *)((long)local_10 + 0x7c);
  GVar6 = SOA<pbrt::Normal3<float>_>::operator[]
                    ((SOA<pbrt::Normal3<float>_> *)(*in_RDI + 0x198),(int)in_RDI[1]);
  local_d0.soa = GVar6.soa;
  local_d0.i = GVar6.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_d0,pNVar1);
  pVVar2 = (Vector3f *)((long)local_10 + 0xbc);
  GVar7 = SOA<pbrt::Vector3<float>_>::operator[]
                    ((SOA<pbrt::Vector3<float>_> *)(*in_RDI + 0x1b8),(int)in_RDI[1]);
  local_e0.soa = GVar7.soa;
  local_e0.i = GVar7.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_e0,pVVar2);
  a_00 = (Point2f *)(local_10 + 0x11);
  GVar8 = SOA<pbrt::Point2<float>_>::operator[]
                    ((SOA<pbrt::Point2<float>_> *)(*in_RDI + 0x1d8),(int)in_RDI[1]);
  local_f0.soa = GVar8.soa;
  local_f0.i = GVar8.i;
  SOA<pbrt::Point2<float>_>::GetSetIndirector::operator=(&local_f0,a_00);
  *(undefined4 *)(*(long *)(*in_RDI + 0x1f0) + (long)(int)in_RDI[1] * 4) =
       *(undefined4 *)(local_10 + 9);
  *(undefined4 *)(*(long *)(*in_RDI + 0x1f8) + (long)(int)in_RDI[1] * 4) =
       *(undefined4 *)(local_10 + 0x12);
  *(undefined4 *)(*(long *)(*in_RDI + 0x200) + (long)(int)in_RDI[1] * 4) =
       *(undefined4 *)((long)local_10 + 0x44);
  *(undefined4 *)(*(long *)(*in_RDI + 0x208) + (long)(int)in_RDI[1] * 4) =
       *(undefined4 *)(local_10 + 0x17);
  *(undefined4 *)(*(long *)(*in_RDI + 0x210) + (long)(int)in_RDI[1] * 4) =
       *(undefined4 *)(local_10 + 0x1d);
  SOA<pbrt::MediumInterface>::operator[]
            ((SOA<pbrt::MediumInterface> *)(*in_RDI + 0x218),(int)in_RDI[1]);
  SOA<pbrt::MediumInterface>::GetSetIndirector::operator=(this_00,in_stack_fffffffffffffe78);
  *(undefined4 *)(*(long *)(*in_RDI + 0x230) + (long)(int)in_RDI[1] * 4) =
       *(undefined4 *)((long)local_10 + 0xb4);
  return;
}

Assistant:

PBRT_CPU_GPU
        void operator=(const MaterialEvalWorkItem<ConcreteMaterial> &a) {
            soa->material[i] = a.material;
            soa->lambda[i] = a.lambda;
            soa->beta[i] = a.beta;
            soa->r_u[i] = a.r_u;
            soa->pi[i] = a.pi;
            soa->n[i] = a.n;
            soa->ns[i] = a.ns;
            soa->dpdu[i] = a.dpdu;
            soa->dpdv[i] = a.dpdv;
            soa->dpdus[i] = a.dpdus;
            soa->dpdvs[i] = a.dpdvs;
            soa->dndus[i] = a.dndus;
            soa->dndvs[i] = a.dndvs;
            soa->wo[i] = a.wo;
            soa->uv[i] = a.uv;
            soa->depth[i] = a.depth;
            soa->faceIndex[i] = a.faceIndex;
            soa->time[i] = a.time;
            soa->anyNonSpecularBounces[i] = a.anyNonSpecularBounces;
            soa->etaScale[i] = a.etaScale;
            soa->mediumInterface[i] = a.mediumInterface;
            soa->pixelIndex[i] = a.pixelIndex;
        }